

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_geometric.h
# Opt level: O2

bool __thiscall Vector::operator==(Vector *this,Vector *v)

{
  if ((this->m_vec[0] == v->m_vec[0]) && (this->m_vec[1] == v->m_vec[1])) {
    return this->m_vec[2] == v->m_vec[2];
  }
  return false;
}

Assistant:

float Z() const { return m_vec[2]; }